

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

void mcmgfre(mcmcx1def *ctx,mcmon obj)

{
  mcmodef *pmVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  
  pmVar1 = ctx->mcmcxtab[CONCAT62(in_register_00000032,obj) >> 8 & 0xffffff];
  uVar2 = (ulong)((obj & 0xff) << 5);
  if ((&pmVar1->mcmolcnt)[uVar2] == '\0') {
    if ((*(byte *)((long)&pmVar1->mcmoflg + uVar2) & 0x10) != 0) {
      mcmunl(ctx,obj,&ctx->mcmcxlru);
    }
    mcmlnkhd(ctx,&ctx->mcmcxfre,obj);
    *(undefined2 *)((long)&pmVar1->mcmoflg + uVar2) = 0x80;
    return;
  }
  errsigf(ctx->mcmcxerr,"TADS",0x10);
}

Assistant:

void mcmgfre(mcmcx1def *ctx, mcmon obj)
{
    mcmodef   *o = mcmgobje(ctx, obj);
    
    MCMGLBCTX(ctx);
    
    /* signal an error if the object is locked */
    if (o->mcmolcnt) errsig(ctx->mcmcxerr, ERR_LCKFRE);

    /* take out of LRU chain if it's in the chain */
    if (o->mcmoflg & MCMOFLRU) mcmunl(ctx, obj, &ctx->mcmcxlru);
    
    /* put it in the free list */
    mcmlnkhd(ctx, &ctx->mcmcxfre, obj);
    o->mcmoflg = MCMOFFREE;
}